

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfsfileengine.cpp
# Opt level: O0

bool __thiscall QFSFileEnginePrivate::seekFdFh(QFSFileEnginePrivate *this,qint64 pos)

{
  long lVar1;
  uint uVar2;
  int iVar3;
  QString *errorString;
  int *piVar4;
  __off64_t _Var5;
  __off64_t in_RSI;
  QFSFileEnginePrivate *in_RDI;
  long in_FS_OFFSET;
  int ret;
  QFSFileEngine *q;
  QString *in_stack_ffffffffffffff60;
  undefined8 in_stack_ffffffffffffff68;
  FileError FVar6;
  undefined7 in_stack_ffffffffffffff70;
  undefined1 in_stack_ffffffffffffff77;
  undefined1 uVar7;
  bool local_59;
  
  FVar6 = (FileError)((ulong)in_stack_ffffffffffffff68 >> 0x20);
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  errorString = (QString *)q_func(in_RDI);
  if ((in_RDI->lastIOCommand == IOFlushCommand) ||
     (uVar2 = (**(_func_int **)&(errorString->d).d[2].super_QArrayData)(), (uVar2 & 1) != 0)) {
    if (in_RSI < 0) {
      local_59 = false;
    }
    else {
      if (in_RDI->fh == (FILE *)0x0) {
        _Var5 = lseek64(in_RDI->fd,in_RSI,0);
        if (_Var5 == -1) {
          __errno_location();
          QSystemError::stdString(FVar6);
          QAbstractFileEngine::setError
                    ((QAbstractFileEngine *)
                     CONCAT17(in_stack_ffffffffffffff77,in_stack_ffffffffffffff70),FVar6,errorString
                    );
          QString::~QString((QString *)0x19df2b);
          local_59 = false;
          goto LAB_0019df65;
        }
      }
      else {
        do {
          iVar3 = fseeko64((FILE *)in_RDI->fh,in_RSI,0);
          uVar7 = false;
          if (iVar3 != 0) {
            piVar4 = __errno_location();
            uVar7 = *piVar4 == 4;
          }
        } while ((bool)uVar7 != false);
        if (iVar3 != 0) {
          __errno_location();
          FVar6 = (FileError)((ulong)errorString >> 0x20);
          QSystemError::stdString(FVar6);
          QAbstractFileEngine::setError
                    ((QAbstractFileEngine *)CONCAT17(uVar7,in_stack_ffffffffffffff70),FVar6,
                     in_stack_ffffffffffffff60);
          QString::~QString((QString *)0x19dec6);
          local_59 = false;
          goto LAB_0019df65;
        }
      }
      local_59 = true;
    }
  }
  else {
    local_59 = false;
  }
LAB_0019df65:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return local_59;
}

Assistant:

bool QFSFileEnginePrivate::seekFdFh(qint64 pos)
{
    Q_Q(QFSFileEngine);

    // On Windows' stdlib implementation, the results of calling fread and
    // fwrite are undefined if not called either in sequence, or if preceded
    // with a call to fflush().
    if (lastIOCommand != QFSFileEnginePrivate::IOFlushCommand && !q->flush())
        return false;

    if (pos < 0 || pos != qint64(QT_OFF_T(pos)))
        return false;

    if (fh) {
        // Buffered stdlib mode.
        int ret;
        do {
            ret = QT_FSEEK(fh, QT_OFF_T(pos), SEEK_SET);
        } while (ret != 0 && errno == EINTR);

        if (ret != 0) {
            q->setError(QFile::ReadError, QSystemError::stdString(errno));
            return false;
        }
    } else {
        // Unbuffered stdio mode.
        if (QT_LSEEK(fd, QT_OFF_T(pos), SEEK_SET) == -1) {
            q->setError(QFile::PositionError, QSystemError::stdString(errno));
            qWarning("QFile::at: Cannot set file position %lld", pos);
            return false;
        }
    }
    return true;
}